

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::Swap
          (FlatBufferBuilderImpl<false> *this,FlatBufferBuilderImpl<false> *other)

{
  bool bVar1;
  voffset_t vVar2;
  uoffset_t uVar3;
  size_t sVar4;
  StringOffsetMap *pSVar5;
  
  vector_downward<unsigned_int>::swap(&this->buf_,&other->buf_);
  uVar3 = this->num_field_loc;
  this->num_field_loc = other->num_field_loc;
  other->num_field_loc = uVar3;
  vVar2 = this->max_voffset_;
  this->max_voffset_ = other->max_voffset_;
  other->max_voffset_ = vVar2;
  sVar4 = this->length_of_64_bit_region_;
  this->length_of_64_bit_region_ = other->length_of_64_bit_region_;
  other->length_of_64_bit_region_ = sVar4;
  bVar1 = this->nested;
  this->nested = other->nested;
  other->nested = bVar1;
  bVar1 = this->finished;
  this->finished = other->finished;
  other->finished = bVar1;
  sVar4 = this->minalign_;
  this->minalign_ = other->minalign_;
  other->minalign_ = sVar4;
  bVar1 = this->force_defaults_;
  this->force_defaults_ = other->force_defaults_;
  other->force_defaults_ = bVar1;
  bVar1 = this->dedup_vtables_;
  this->dedup_vtables_ = other->dedup_vtables_;
  other->dedup_vtables_ = bVar1;
  pSVar5 = this->string_pool;
  this->string_pool = other->string_pool;
  other->string_pool = pSVar5;
  return;
}

Assistant:

void Swap(FlatBufferBuilderImpl &other) {
    using std::swap;
    buf_.swap(other.buf_);
    swap(num_field_loc, other.num_field_loc);
    swap(max_voffset_, other.max_voffset_);
    swap(length_of_64_bit_region_, other.length_of_64_bit_region_);
    swap(nested, other.nested);
    swap(finished, other.finished);
    swap(minalign_, other.minalign_);
    swap(force_defaults_, other.force_defaults_);
    swap(dedup_vtables_, other.dedup_vtables_);
    swap(string_pool, other.string_pool);
  }